

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_hatch.cpp
# Opt level: O3

void __thiscall ON_HatchLoop::Dump(ON_HatchLoop *this,ON_TextLog *dump)

{
  eLoopType eVar1;
  
  eVar1 = this->m_type;
  if (eVar1 == ltOuter) {
    ON_TextLog::Print(dump,"Outer hatch loop\n");
    eVar1 = this->m_type;
  }
  if (eVar1 == ltInner) {
    ON_TextLog::Print(dump,"Inner hatch loop\n");
  }
  if (this->m_p2dCurve != (ON_Curve *)0x0) {
    ON_TextLog::Print(dump,"2d curve:\n");
    (*(this->m_p2dCurve->super_ON_Geometry).super_ON_Object._vptr_ON_Object[7])
              (this->m_p2dCurve,dump);
    return;
  }
  ON_TextLog::Print(dump,"2d curve: null pointer\n");
  return;
}

Assistant:

void ON_HatchLoop::Dump( ON_TextLog& dump) const
{
  if( m_type == ltOuter)
    dump.Print( "Outer hatch loop\n");
  if( m_type == ltInner)
    dump.Print( "Inner hatch loop\n");

  if ( 0 == m_p2dCurve )
  {
    dump.Print( "2d curve: null pointer\n");
  }
  else
  {
    dump.Print( "2d curve:\n");
    m_p2dCurve->Dump(dump);
  }

}